

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

void Wln_ObjSetSlice(Wln_Ntk_t *p,int iObj,int SliceId)

{
  int iVar1;
  int SliceId_local;
  int iObj_local;
  Wln_Ntk_t *p_local;
  
  iVar1 = Wln_ObjIsSlice(p,iObj);
  if (iVar1 != 0) {
    Wln_ObjSetFanin(p,iObj,1,SliceId);
    return;
  }
  __assert_fail("Wln_ObjIsSlice(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                ,0x48,"void Wln_ObjSetSlice(Wln_Ntk_t *, int, int)");
}

Assistant:

void Wln_ObjSetSlice( Wln_Ntk_t * p, int iObj, int SliceId )
{
    assert( Wln_ObjIsSlice(p, iObj) );
    Wln_ObjSetFanin( p, iObj, 1, SliceId );
}